

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_corrode_lock(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  OBJ_DATA *pOVar5;
  ulong uVar6;
  long in_RDX;
  __type_conflict2 _Var7;
  EXIT_DATA *pexit_rev;
  EXIT_DATA *pexit;
  ROOM_INDEX_DATA *to_room;
  int door;
  OBJ_DATA *obj;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffed58;
  char *in_stack_ffffffffffffed60;
  void *arg1;
  CHAR_DATA *in_stack_ffffffffffffed68;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffed70;
  char *txt;
  char *in_stack_ffffffffffffed90;
  CHAR_DATA *in_stack_ffffffffffffed98;
  char local_1228;
  int in_stack_ffffffffffffee34;
  undefined1 in_stack_ffffffffffffee3b;
  int in_stack_ffffffffffffee3c;
  CHAR_DATA *in_stack_ffffffffffffee40;
  int in_stack_ffffffffffffee5c;
  CHAR_DATA *in_stack_ffffffffffffee60;
  
  target_name = one_argument(in_stack_ffffffffffffed60,(char *)in_stack_ffffffffffffed58);
  if (local_1228 == '\0') {
    send_to_char(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
  }
  else {
    iVar3 = number_percent();
    iVar4 = get_skill(in_stack_ffffffffffffee60,in_stack_ffffffffffffee5c);
    if (iVar4 < iVar3) {
      send_to_char(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
      check_improve(in_stack_ffffffffffffee40,in_stack_ffffffffffffee3c,
                    (bool)in_stack_ffffffffffffee3b,in_stack_ffffffffffffee34);
    }
    else {
      pOVar5 = get_obj_here(in_stack_ffffffffffffed68,in_stack_ffffffffffffed60);
      if (pOVar5 == (OBJ_DATA *)0x0) {
        iVar3 = find_door(in_stack_ffffffffffffed98,in_stack_ffffffffffffed90);
        if (-1 < iVar3) {
          plVar1 = *(long **)(*(long *)(in_RDX + 0xa8) + 0x38 + (long)iVar3 * 8);
          txt = (char *)plVar1[1];
          _Var7 = std::pow<int,int>(0,0x6e0fef);
          if ((((ulong)txt & (long)_Var7) != 0) ||
             (bVar2 = is_immortal(in_stack_ffffffffffffed58), bVar2)) {
            if ((-1 < (short)plVar1[3]) || (bVar2 = is_immortal(in_stack_ffffffffffffed58), bVar2))
            {
              ch_00 = (CHAR_DATA *)plVar1[1];
              _Var7 = std::pow<int,int>(0,0x6e107e);
              if (((ulong)ch_00 & (long)_Var7) == 0) {
                send_to_char(txt,ch_00);
              }
              else {
                arg1 = (void *)plVar1[1];
                _Var7 = std::pow<int,int>(0,0x6e10c7);
                if ((((ulong)arg1 & (long)_Var7) == 0) ||
                   (bVar2 = is_immortal(in_stack_ffffffffffffed58), bVar2)) {
                  _Var7 = std::pow<int,int>(0,0x6e1110);
                  plVar1[1] = ((long)_Var7 ^ 0xffffffffffffffffU) & plVar1[1];
                  send_to_char(txt,ch_00);
                  act(txt,ch_00,arg1,in_stack_ffffffffffffed58,0);
                  check_improve(in_stack_ffffffffffffee40,in_stack_ffffffffffffee3c,
                                (bool)in_stack_ffffffffffffee3b,in_stack_ffffffffffffee34);
                  if ((*plVar1 != 0) &&
                     ((plVar1 = *(long **)(*plVar1 + 0x38 + (long)rev_dir[iVar3] * 8),
                      plVar1 != (long *)0x0 && (*plVar1 == *(long *)(in_RDX + 0xa8))))) {
                    _Var7 = std::pow<int,int>(0,0x6e11dd);
                    plVar1[1] = ((long)_Var7 ^ 0xffffffffffffffffU) & plVar1[1];
                  }
                }
                else {
                  send_to_char(txt,ch_00);
                }
              }
            }
            else {
              send_to_char(txt,in_stack_ffffffffffffed68);
            }
          }
          else {
            send_to_char(txt,in_stack_ffffffffffffed68);
          }
        }
      }
      else {
        if (pOVar5->item_type == 0x1d) {
          iVar3 = pOVar5->value[1];
          _Var7 = std::pow<int,int>(0,0x6e0cb0);
          if (((long)iVar3 & (long)_Var7) == 0) {
            send_to_char(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
            return;
          }
          uVar6 = (ulong)pOVar5->value[1];
          _Var7 = std::pow<int,int>(0,0x6e0cfc);
          if ((uVar6 & (long)_Var7) == 0) {
            send_to_char(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
            return;
          }
          if (pOVar5->value[4] < 0) {
            send_to_char(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
            return;
          }
          uVar6 = (ulong)pOVar5->value[1];
          _Var7 = std::pow<int,int>(0,0x6e0d6f);
          if ((uVar6 & (long)_Var7) != 0) {
            send_to_char(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
            return;
          }
          _Var7 = std::pow<int,int>(0,0x6e0da7);
          pOVar5->value[1] = pOVar5->value[1] & ((uint)(long)_Var7 ^ 0xffffffff);
        }
        else {
          if (pOVar5->item_type != 0xf) {
            send_to_char(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
            return;
          }
          iVar3 = pOVar5->value[1];
          _Var7 = std::pow<int,int>(0,0x6e0e11);
          if (((long)iVar3 & (long)_Var7) == 0) {
            send_to_char(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
            return;
          }
          if (pOVar5->value[2] < 0) {
            send_to_char(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
            return;
          }
          iVar3 = pOVar5->value[1];
          _Var7 = std::pow<int,int>(0,0x6e0e84);
          if (((long)iVar3 & (long)_Var7) == 0) {
            send_to_char(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
            return;
          }
          iVar3 = pOVar5->value[1];
          _Var7 = std::pow<int,int>(0,0x6e0ed0);
          if (((long)iVar3 & (long)_Var7) != 0) {
            send_to_char(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
            return;
          }
          _Var7 = std::pow<int,int>(0,0x6e0f0b);
          pOVar5->value[1] = pOVar5->value[1] & ((uint)(long)_Var7 ^ 0xffffffff);
        }
        act(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
            in_stack_ffffffffffffed58,0);
        act(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
            in_stack_ffffffffffffed58,0);
        check_improve(in_stack_ffffffffffffee40,in_stack_ffffffffffffee3c,
                      (bool)in_stack_ffffffffffffee3b,in_stack_ffffffffffffee34);
      }
    }
  }
  return;
}

Assistant:

void spell_corrode_lock(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char arg[MAX_INPUT_LENGTH];
	OBJ_DATA *obj;
	int door;

	target_name = one_argument(target_name, arg);

	if (arg[0] == '\0')
	{
		send_to_char("What are you trying to corrode?\n\r", ch);
		return;
	}

	if (number_percent() > get_skill(ch, gsn_corrode_lock))
	{
		send_to_char("Your acid touch has no effect on the lock.\n\r", ch);
		check_improve(ch, gsn_pick_lock, false, 2);
		return;
	}
	else
	{
		obj = get_obj_here(ch, arg);

		if (obj != nullptr)
		{
			if (obj->item_type == ITEM_PORTAL)
			{
				if (!IS_SET_OLD(obj->value[1], EX_ISDOOR))
				{
					send_to_char("You can't do that.\n\r", ch);
					return;
				}

				if (!IS_SET_OLD(obj->value[1], EX_CLOSED))
				{
					send_to_char("It's not closed.\n\r", ch);
					return;
				}

				if (obj->value[4] < 0)
				{
					send_to_char("It can not be melted.\n\r", ch);
					return;
				}

				if (IS_SET_OLD(obj->value[1], EX_PICKPROOF))
				{
					send_to_char("You failed.\n\r", ch);
					return;
				}

				REMOVE_BIT_OLD(obj->value[1], EX_LOCKED);
			}
			else
			{
				if (obj->item_type != ITEM_CONTAINER)
				{
					send_to_char("That's not a container.\n\r", ch);
					return;
				}

				if (!IS_SET_OLD(obj->value[1], CONT_CLOSED))
				{
					send_to_char("It's not closed.\n\r", ch);
					return;
				}

				if (obj->value[2] < 0)
				{
					send_to_char("It can not be melted.\n\r", ch);
					return;
				}

				if (!IS_SET_OLD(obj->value[1], CONT_LOCKED))
				{
					send_to_char("It's already unlocked.\n\r", ch);
					return;
				}

				if (IS_SET_OLD(obj->value[1], CONT_PICKPROOF))
				{
					send_to_char("You failed.\n\r", ch);
					return;
				}

				REMOVE_BIT_OLD(obj->value[1], CONT_LOCKED);
			}

			act("You touch $p with an acid coated hand and corrode the lock.", ch, obj, nullptr, TO_CHAR);
			act("$n corrodes the lock on $p with his acid touch.", ch, obj, nullptr, TO_ROOM);

			check_improve(ch, gsn_corrode_lock, true, 2);
			return;
		}
		else if ((door = find_door(ch, arg)) >= 0)
		{
			ROOM_INDEX_DATA *to_room;
			EXIT_DATA *pexit;
			EXIT_DATA *pexit_rev;

			pexit = ch->in_room->exit[door];

			if (!IS_SET(pexit->exit_info, EX_CLOSED) && !is_immortal(ch))
			{
				send_to_char("It's not closed.\n\r", ch);
				return;
			}

			if (pexit->key < 0 && !is_immortal(ch))
			{
				send_to_char("It can't be corroded.\n\r", ch);
				return;
			}

			if (!IS_SET(pexit->exit_info, EX_LOCKED))
			{
				send_to_char("It's already unlocked.\n\r", ch);
				return;
			}

			if (IS_SET(pexit->exit_info, EX_PICKPROOF) && !is_immortal(ch))
			{
				send_to_char("You failed.\n\r", ch);
				return;
			}

			REMOVE_BIT(pexit->exit_info, EX_LOCKED);

			send_to_char("You corrode the lock on the door.\n\r", ch);
			act("$n corrodes the lock on $T.", ch, nullptr, pexit->keyword, TO_ROOM);

			check_improve(ch, gsn_corrode_lock, true, 2);

			if ((to_room = pexit->u1.to_room) != nullptr
				&& (pexit_rev = to_room->exit[rev_dir[door]]) != nullptr
				&& pexit_rev->u1.to_room == ch->in_room)
			{
				REMOVE_BIT(pexit_rev->exit_info, EX_LOCKED);
			}
		}
	}
}